

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O0

void Kit_TruthCountOnesInCofs_64bit(word *pTruth,int nVars,int *pStore)

{
  int iVar1;
  int iVar2;
  uint local_2c;
  int Counter;
  int k;
  int i;
  int nWords;
  int *pStore_local;
  word *pwStack_10;
  int nVars_local;
  word *pTruth_local;
  
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  memset(pStore,0,(long)nVars << 2);
  if (nVars < 7) {
    if (0 < nVars) {
      iVar1 = Kit_WordCountOnes_64bit(*pTruth & 0x5555555555555555);
      *pStore = iVar1;
    }
    if (1 < nVars) {
      iVar1 = Kit_WordCountOnes_64bit(*pTruth & 0x3333333333333333);
      pStore[1] = iVar1;
    }
    if (2 < nVars) {
      iVar1 = Kit_WordCountOnes_64bit(*pTruth & 0xf0f0f0f0f0f0f0f);
      pStore[2] = iVar1;
    }
    if (3 < nVars) {
      iVar1 = Kit_WordCountOnes_64bit(*pTruth & 0xff00ff00ff00ff);
      pStore[3] = iVar1;
    }
    if (4 < nVars) {
      iVar1 = Kit_WordCountOnes_64bit(*pTruth & 0xffff0000ffff);
      pStore[4] = iVar1;
    }
    if (5 < nVars) {
      iVar1 = Kit_WordCountOnes_64bit(*pTruth & 0xffffffff);
      pStore[5] = iVar1;
    }
  }
  else {
    for (local_2c = 0; (int)local_2c < iVar1; local_2c = local_2c + 1) {
      iVar2 = Kit_WordCountOnes_64bit(pTruth[(int)local_2c]);
      for (Counter = 6; Counter < nVars; Counter = Counter + 1) {
        if ((local_2c & 1 << ((char)Counter - 6U & 0x1f)) == 0) {
          pStore[Counter] = iVar2 + pStore[Counter];
        }
      }
    }
    pwStack_10 = pTruth;
    for (local_2c = iVar1 / 2; 0 < (int)local_2c; local_2c = local_2c + -1) {
      iVar1 = Kit_WordCountOnes_64bit
                        (*pwStack_10 & 0x5555555555555555 |
                         (pwStack_10[1] & 0x5555555555555555) << 1);
      *pStore = iVar1 + *pStore;
      iVar1 = Kit_WordCountOnes_64bit
                        (*pwStack_10 & 0x3333333333333333 |
                         (pwStack_10[1] & 0x3333333333333333) << 2);
      pStore[1] = iVar1 + pStore[1];
      iVar1 = Kit_WordCountOnes_64bit
                        (*pwStack_10 & 0xf0f0f0f0f0f0f0f | (pwStack_10[1] & 0xf0f0f0f0f0f0f0f) << 4)
      ;
      pStore[2] = iVar1 + pStore[2];
      iVar1 = Kit_WordCountOnes_64bit
                        (*pwStack_10 & 0xff00ff00ff00ff | (pwStack_10[1] & 0xff00ff00ff00ff) << 8);
      pStore[3] = iVar1 + pStore[3];
      iVar1 = Kit_WordCountOnes_64bit
                        (*pwStack_10 & 0xffff0000ffff | (pwStack_10[1] & 0xffff0000ffff) << 0x10);
      pStore[4] = iVar1 + pStore[4];
      iVar1 = Kit_WordCountOnes_64bit(*pwStack_10 & 0xffffffff | pwStack_10[1] << 0x20);
      pStore[5] = iVar1 + pStore[5];
      pwStack_10 = pwStack_10 + 2;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs_64bit( word * pTruth, int nVars, int * pStore )
{    
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 6 )
    {
        if ( nVars > 0 )        
            pStore[0] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x5555555555555555) );  
        if ( nVars > 1 )       
            pStore[1] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x3333333333333333) );     
        if ( nVars > 2 )       
            pStore[2] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F) );   
        if ( nVars > 3 )       
            pStore[3] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF) );     
        if ( nVars > 4 )       
            pStore[4] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF) ); 
        if ( nVars > 5 )       
            pStore[5] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00000000FFFFFFFF) );      
        return;
    }
    // nVars > 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes_64bit( pTruth[k] );
        for ( i = 6; i < nVars; i++ )
            if ( (k & (1 << (i-6))) == 0)
                pStore[i] += Counter;
    }
    // count 1's for the first six variables
    for ( k = nWords/2; k>0; k-- )
    {
        pStore[0] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x5555555555555555)) | ((pTruth[1] & ABC_CONST(0x5555555555555555)) <<  1) );
        pStore[1] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x3333333333333333)) | ((pTruth[1] & ABC_CONST(0x3333333333333333)) <<  2) );
        pStore[2] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) | ((pTruth[1] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) <<  4) );
        pStore[3] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF)) | ((pTruth[1] & ABC_CONST(0x00FF00FF00FF00FF)) <<  8) );
        pStore[4] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF)) | ((pTruth[1] & ABC_CONST(0x0000FFFF0000FFFF)) <<  16) );
        pStore[5] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00000000FFFFFFFF)) | ((pTruth[1] & ABC_CONST(0x00000000FFFFFFFF)) <<  32) );  
        pTruth += 2;
    }
}